

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Transmitter_PDU::Transmitter_PDU(Transmitter_PDU *this,Header *H,KDataStream *stream)

{
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,H);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_0022b868;
  DATA_TYPE::RadioEntityType::RadioEntityType(&this->m_RadioEntityType);
  DATA_TYPE::AntennaLocation::AntennaLocation(&this->m_AntennaLocation);
  DATA_TYPE::ModulationType::ModulationType(&this->m_ModulationType);
  DATA_TYPE::CryptoSystem::CryptoSystem(&this->m_CryptoSystem);
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6[3])
            (this,stream,1);
  return;
}

Assistant:

Transmitter_PDU::Transmitter_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Radio_Communications_Header( H )
{
    Decode( stream, true );
}